

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.h
# Opt level: O3

ScopeSlots __thiscall Js::SlotArrayVariablesWalker::GetSlotArray(SlotArrayVariablesWalker *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long in_RSI;
  _func_int **pp_Var4;
  
  pp_Var4 = *(_func_int ***)(in_RSI + 0x10);
  if (pp_Var4 == (_func_int **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/DiagObjectModel.h"
                                ,0x101,"(slotArray != nullptr)","slotArray != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pp_Var4 = (_func_int **)0x0;
  }
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase
       = pp_Var4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return (ScopeSlots)(Type)this;
}

Assistant:

ScopeSlots GetSlotArray()
        {
            Field(Var) *slotArray = (Field(Var) *) instance;
            Assert(slotArray != nullptr);
            return ScopeSlots(slotArray);
        }